

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_Client_Subscriptions_manuallySendPublishRequest(UA_Client *client)

{
  ListOfUnacknowledgedNotifications *pLVar1;
  int iVar2;
  UA_Client_NotificationsAckNumber **ppUVar3;
  ulong *puVar4;
  char cVar5;
  long lVar6;
  UA_UInt32 *pUVar7;
  UA_ExtensionObject *pUVar8;
  UA_Client_MonitoredItem *pUVar9;
  ulong uVar10;
  UA_Client_NotificationsAckNumber *pUVar11;
  UA_Client_NotificationsAckNumber *pUVar12;
  ulong uVar13;
  UA_ExtensionObject *pUVar14;
  ulong uVar15;
  UA_DiagnosticInfo **ppUVar16;
  size_t __size;
  undefined8 *puVar17;
  ulong uVar18;
  UA_Client_Subscription *pUVar19;
  UA_StatusCode UVar20;
  byte bVar21;
  undefined8 local_230 [16];
  undefined1 local_1b0 [8];
  UA_PublishResponse response;
  UA_ExtensionObject *local_58;
  void *pvStack_50;
  
  bVar21 = 0;
  UVar20 = 0x800d0000;
  if (client->state != UA_CLIENTSTATE_ERRORED) {
    pLVar1 = &client->pendingNotificationsAcks;
    do {
      local_58 = (UA_ExtensionObject *)0x0;
      pvStack_50 = (void *)0x0;
      response.diagnosticInfos = (UA_DiagnosticInfo *)0x0;
      pUVar11 = pLVar1->lh_first;
      if (pUVar11 != (UA_Client_NotificationsAckNumber *)0x0) {
        __size = 0;
        lVar6 = 0;
        pUVar12 = pUVar11;
        do {
          pUVar12 = (pUVar12->listEntry).le_next;
          lVar6 = lVar6 + -1;
          __size = __size + 8;
        } while (pUVar12 != (UA_Client_NotificationsAckNumber *)0x0);
        local_58 = (UA_ExtensionObject *)-lVar6;
        if ((lVar6 != 0) && (pvStack_50 = malloc(__size), pvStack_50 == (void *)0x0)) {
          return 0;
        }
        if (pUVar11 != (UA_Client_NotificationsAckNumber *)0x0) {
          pUVar7 = (UA_UInt32 *)((long)pvStack_50 + 4);
          do {
            *pUVar7 = (pUVar11->subAck).sequenceNumber;
            pUVar7[-1] = (pUVar11->subAck).subscriptionId;
            pUVar11 = (pUVar11->listEntry).le_next;
            pUVar7 = pUVar7 + 2;
          } while (pUVar11 != (UA_Client_NotificationsAckNumber *)0x0);
        }
      }
      ppUVar16 = &response.diagnosticInfos;
      puVar17 = local_230;
      for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar17 = *ppUVar16;
        ppUVar16 = ppUVar16 + (ulong)bVar21 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
      }
      __UA_Client_Service(client,local_230,UA_TYPES + 0x6f,local_1b0,UA_TYPES + 0x4e);
      pUVar19 = (UA_Client_Subscription *)&client->subscriptions;
      if (response.responseHeader.timestamp._4_4_ == 0) {
        do {
          pUVar19 = (pUVar19->listEntry).le_next;
          if (pUVar19 == (UA_Client_Subscription *)0x0) goto LAB_001288fe;
        } while (pUVar19->subscriptionID != response.responseHeader.additionalHeader.content._32_4_)
        ;
        if (response.notificationMessage.notificationData != (UA_ExtensionObject *)0x0) {
          pUVar14 = (UA_ExtensionObject *)0x0;
          pUVar8 = response.notificationMessage.notificationData;
          do {
            if (local_58 <= pUVar14) break;
            iVar2 = *(int *)(response.resultsSize + (long)pUVar14 * 4);
            if (((iVar2 == 0) || (iVar2 == -0x7f860000)) &&
               (pUVar11 = pLVar1->lh_first, pUVar11 != (UA_Client_NotificationsAckNumber *)0x0)) {
              do {
                if (((pUVar11->subAck).subscriptionId ==
                     *(UA_UInt32 *)((long)pvStack_50 + (long)pUVar14 * 8)) &&
                   ((pUVar11->subAck).sequenceNumber ==
                    *(UA_UInt32 *)((long)pvStack_50 + (long)pUVar14 * 8 + 4))) {
                  pUVar12 = (pUVar11->listEntry).le_next;
                  ppUVar3 = (pUVar11->listEntry).le_prev;
                  if (pUVar12 != (UA_Client_NotificationsAckNumber *)0x0) {
                    (pUVar12->listEntry).le_prev = ppUVar3;
                  }
                  *ppUVar3 = pUVar12;
                  free(pUVar11);
                  pUVar8 = response.notificationMessage.notificationData;
                  if (pUVar11 == pLVar1->lh_first) {
                    __assert_fail("ack != ((&client->pendingNotificationsAcks)->lh_first)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                                  ,0x671e,
                                  "void UA_Client_processPublishResponse(UA_Client *, UA_PublishRequest *, UA_PublishResponse *)"
                                 );
                  }
                  break;
                }
                pUVar11 = (pUVar11->listEntry).le_next;
              } while (pUVar11 != (UA_Client_NotificationsAckNumber *)0x0);
            }
            pUVar14 = (UA_ExtensionObject *)((long)&pUVar14->encoding + 1);
          } while (pUVar14 < pUVar8);
        }
        if (response.notificationMessage.publishTime != 0) {
          uVar15 = 0;
          uVar10 = response.notificationMessage.publishTime;
          do {
            if ((*(int *)(response.notificationMessage.notificationDataSize + uVar15 * 0x30) == 3)
               && (lVar6 = response.notificationMessage.notificationDataSize + uVar15 * 0x30,
                  *(long *)(lVar6 + 8) == 0x13f8e0)) {
              puVar4 = *(ulong **)(lVar6 + 0x10);
              uVar13 = *puVar4;
              if (uVar13 != 0) {
                uVar18 = 0;
                do {
                  pUVar7 = (UA_UInt32 *)(uVar18 * 0x68 + puVar4[1]);
                  pUVar9 = (UA_Client_MonitoredItem *)&pUVar19->monitoredItems;
                  do {
                    pUVar9 = (pUVar9->listEntry).le_next;
                    if (pUVar9 == (UA_Client_MonitoredItem *)0x0) goto LAB_00128a72;
                  } while (pUVar9->clientHandle != *pUVar7);
                  (*pUVar9->handler)(pUVar9->monitoredItemId,(UA_DataValue *)(pUVar7 + 2),
                                     pUVar9->handlerContext);
                  uVar13 = *puVar4;
LAB_00128a72:
                  uVar18 = uVar18 + 1;
                  uVar10 = response.notificationMessage.publishTime;
                } while (uVar18 < uVar13);
              }
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar10);
        }
        pUVar11 = (UA_Client_NotificationsAckNumber *)malloc(0x18);
        if (pUVar11 == (UA_Client_NotificationsAckNumber *)0x0) {
          UA_LOG_WARNING((client->config).logger,UA_LOGCATEGORY_CLIENT,
                         "Not enough memory to store the acknowledgement for a publish message on subscription %u"
                         ,(ulong)pUVar19->subscriptionID);
        }
        else {
          (pUVar11->subAck).sequenceNumber = response._160_4_;
          (pUVar11->subAck).subscriptionId = pUVar19->subscriptionID;
          pUVar12 = pLVar1->lh_first;
          (pUVar11->listEntry).le_next = pUVar12;
          if (pUVar12 != (UA_Client_NotificationsAckNumber *)0x0) {
            (pUVar12->listEntry).le_prev = (UA_Client_NotificationsAckNumber **)pUVar11;
          }
          pLVar1->lh_first = pUVar11;
          (pUVar11->listEntry).le_prev = &pLVar1->lh_first;
        }
      }
LAB_001288fe:
      cVar5 = (char)response.availableSequenceNumbers;
      deleteMembers_noInit(local_1b0,UA_TYPES + 0x4e);
      UVar20 = 0;
      memset(local_1b0,0,0xe8);
      deleteMembers_noInit(&response.diagnosticInfos,UA_TYPES + 0x6f);
    } while (cVar5 != '\0');
  }
  return UVar20;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_manuallySendPublishRequest(UA_Client *client) {
    if (client->state == UA_CLIENTSTATE_ERRORED)
        return UA_STATUSCODE_BADSERVERNOTCONNECTED;

    UA_Boolean moreNotifications = true;
    while(moreNotifications) {
        UA_PublishRequest request;
        UA_PublishRequest_init(&request);
        request.subscriptionAcknowledgementsSize = 0;

        UA_Client_NotificationsAckNumber *ack;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry)
            ++request.subscriptionAcknowledgementsSize;
        if(request.subscriptionAcknowledgementsSize > 0) {
            request.subscriptionAcknowledgements =
                UA_malloc(sizeof(UA_SubscriptionAcknowledgement) * request.subscriptionAcknowledgementsSize);
            if(!request.subscriptionAcknowledgements)
                return UA_STATUSCODE_GOOD;
        }

        int i = 0;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry) {
            request.subscriptionAcknowledgements[i].sequenceNumber = ack->subAck.sequenceNumber;
            request.subscriptionAcknowledgements[i].subscriptionId = ack->subAck.subscriptionId;
            ++i;
        }

        UA_PublishResponse response = UA_Client_Service_publish(client, request);
        UA_Client_processPublishResponse(client, &request, &response);
        moreNotifications = response.moreNotifications;

        UA_PublishResponse_deleteMembers(&response);
        UA_PublishRequest_deleteMembers(&request);
    }
    return UA_STATUSCODE_GOOD;
}